

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O2

void gray_render_line(PWorker worker,TPos to_x,TPos to_y)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  TCoord y1;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long ey;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  TPos x2;
  TCoord local_80;
  long local_78;
  
  uVar11 = worker->y;
  lVar7 = (long)uVar11 >> 8;
  ey = to_y >> 8;
  if ((lVar7 < worker->max_ey || ey < worker->max_ey) &&
     (lVar12 = worker->min_ey, lVar12 <= lVar7 || lVar12 <= ey)) {
    uVar3 = uVar11 & 0xff;
    lVar4 = worker->x;
    if (lVar7 == ey) {
      gray_render_scanline(worker,lVar7,lVar4,uVar3,to_x,to_y & 0xffU);
    }
    else {
      uVar11 = to_y - uVar11;
      lVar9 = to_x - lVar4;
      if (lVar9 == 0) {
        lVar8 = to_x >> 8;
        uVar1 = (ulong)(((uint)to_x & 0xff) * 2);
        lVar5 = (ulong)(0 < (long)uVar11) * 0x100;
        lVar4 = lVar5 - uVar3;
        worker->area = worker->area + uVar1 * lVar4;
        worker->cover = worker->cover + (int)lVar4;
        lVar4 = (ulong)(0 < (long)uVar11) * 0x200 + -0x100;
        lVar10 = uVar1 * lVar4;
        lVar9 = worker->count_ey + lVar12;
        iVar2 = (int)lVar4;
        lVar4 = ey;
        if ((long)uVar11 < 0) {
          if (ey < lVar9) {
            lVar4 = lVar9;
          }
          if (lVar7 <= lVar9) {
            lVar4 = lVar7 + -1;
          }
          for (; (gray_set_cell(worker,lVar8,lVar4), ey < lVar4 && (worker->min_ey <= lVar4));
              lVar4 = lVar4 + -1) {
            worker->area = worker->area + lVar10;
            worker->cover = worker->cover + iVar2;
          }
        }
        else {
          if (lVar12 < ey) {
            lVar4 = lVar12;
          }
          if (lVar12 <= lVar7) {
            lVar4 = lVar7 + 1;
          }
          gray_set_cell(worker,lVar8,lVar4);
          if (ey < lVar9) {
            lVar9 = ey;
          }
          while (lVar4 < lVar9) {
            worker->area = worker->area + lVar10;
            worker->cover = worker->cover + iVar2;
            lVar4 = lVar4 + 1;
            gray_set_cell(worker,lVar8,lVar4);
          }
        }
        if (ey != lVar4) {
          gray_set_cell(worker,lVar8,ey);
        }
        iVar2 = (int)lVar5 + ((uint)to_y | 0xffffff00);
        worker->area = worker->area + uVar1 * (long)iVar2;
        worker->cover = worker->cover + iVar2;
      }
      else {
        if ((long)uVar11 < 1) {
          uVar11 = -uVar11;
          local_78 = -1;
          local_80 = 0;
          uVar1 = uVar3;
        }
        else {
          local_80 = 0x100;
          local_78 = 1;
          uVar1 = 0x100 - uVar3;
        }
        lVar5 = (long)(uVar1 * lVar9) % (long)uVar11;
        uVar6 = lVar5 >> 0x3f;
        x2 = (long)(uVar1 * lVar9) / (long)uVar11 + lVar4 + uVar6;
        gray_render_scanline(worker,lVar7,lVar4,uVar3,x2,local_80);
        lVar12 = local_78 + lVar7;
        gray_set_cell(worker,x2 >> 8,lVar12);
        if (lVar12 == ey) {
          y1 = 0x100 - local_80;
        }
        else {
          lVar8 = (lVar9 * 0x100) % (long)uVar11;
          lVar5 = (uVar6 & uVar11) + lVar5;
          uVar3 = lVar8 >> 0x3f;
          y1 = 0x100 - local_80;
          lVar7 = lVar7 + local_78 * 2;
          lVar4 = x2;
          do {
            lVar10 = lVar5 + (uVar3 & uVar11) + lVar8;
            uVar1 = 0;
            if ((long)uVar11 <= lVar10) {
              uVar1 = uVar11;
            }
            lVar5 = lVar10 - uVar1;
            x2 = (ulong)((long)uVar11 <= lVar10) + (lVar9 * 0x100) / (long)uVar11 + uVar3 + lVar4;
            gray_render_scanline(worker,lVar12,lVar4,y1,x2,local_80);
            lVar12 = lVar12 + local_78;
            gray_set_cell(worker,x2 >> 8,lVar7);
            lVar7 = lVar7 + local_78;
            lVar4 = x2;
          } while (ey != lVar12);
        }
        gray_render_scanline(worker,ey,x2,y1,to_x,to_y & 0xffU);
      }
    }
  }
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void
  gray_render_line( RAS_ARG_ TPos  to_x,
                             TPos  to_y )
  {
    TCoord  ey1, ey2, fy1, fy2, first, delta, mod;
    TPos    p, dx, dy, x, x2;
    int     incr;

    ey1 = TRUNC( ras.y );
    ey2 = TRUNC( to_y );     /* if (ey2 >= ras.max_ey) ey2 = ras.max_ey-1; */

    /* perform vertical clipping */
    if ( ( ey1 >= ras.max_ey && ey2 >= ras.max_ey ) ||
         ( ey1 <  ras.min_ey && ey2 <  ras.min_ey ) )
      goto End;

    fy1 = FRACT( ras.y );
    fy2 = FRACT( to_y );

    /* everything is on a single scanline */
    if ( ey1 == ey2 )
    {
      gray_render_scanline( RAS_VAR_ ey1, ras.x, fy1, to_x, fy2 );
      goto End;
    }

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    /* vertical line - avoid calling gray_render_scanline */
    if ( dx == 0 )
    {
      TCoord  ex     = TRUNC( ras.x );
      TCoord  two_fx = FRACT( ras.x ) << 1;
      TPos    area, max_ey1;


      if ( dy > 0)
      {
        first = ONE_PIXEL;
      }
      else
      {
        first = 0;
      }

      delta      = first - fy1;
      ras.area  += (TArea)two_fx * delta;
      ras.cover += delta;

      delta = first + first - ONE_PIXEL;
      area  = (TArea)two_fx * delta;
      max_ey1 = ras.count_ey + ras.min_ey;
      if (dy < 0) {
        if (ey1 > max_ey1) {
          ey1 = (max_ey1 > ey2) ? max_ey1 : ey2;
          gray_set_cell( &ras, ex, ey1 );
        } else {
          ey1--;
          gray_set_cell( &ras, ex, ey1 );
        }
        while ( ey1 > ey2 && ey1 >= ras.min_ey)
        {
          ras.area  += area;
          ras.cover += delta;
          ey1--;

          gray_set_cell( &ras, ex, ey1 );
        }
        if (ey1 != ey2) {
          ey1 = ey2;
          gray_set_cell( &ras, ex, ey1 );
        }
      } else {
        if (ey1 < ras.min_ey) {
          ey1 = (ras.min_ey < ey2) ? ras.min_ey : ey2;
          gray_set_cell( &ras, ex, ey1 );
        } else {
          ey1++;
          gray_set_cell( &ras, ex, ey1 );
        }
        while ( ey1 < ey2 && ey1 < max_ey1)
        {
          ras.area  += area;
          ras.cover += delta;
          ey1++;

          gray_set_cell( &ras, ex, ey1 );
        }
        if (ey1 != ey2) {
          ey1 = ey2;
          gray_set_cell( &ras, ex, ey1 );
        }
      }

      delta      = (int)( fy2 - ONE_PIXEL + first );
      ras.area  += (TArea)two_fx * delta;
      ras.cover += delta;

      goto End;
    }

    /* ok, we have to render several scanlines */
    if ( dy > 0)
    {
      p     = ( ONE_PIXEL - fy1 ) * dx;
      first = ONE_PIXEL;
      incr  = 1;
    }
    else
    {
      p     = fy1 * dx;
      first = 0;
      incr  = -1;
      dy    = -dy;
    }

    /* the fractional part of x-delta is mod/dy. It is essential to */
    /* keep track of its accumulation for accurate rendering.       */
    PVG_FT_DIV_MOD( TCoord, p, dy, delta, mod );

    x = ras.x + delta;
    gray_render_scanline( RAS_VAR_ ey1, ras.x, fy1, x, (TCoord)first );

    ey1 += incr;
    gray_set_cell( RAS_VAR_ TRUNC( x ), ey1 );

    if ( ey1 != ey2 )
    {
      TCoord  lift, rem;


      p    = ONE_PIXEL * dx;
      PVG_FT_DIV_MOD( TCoord, p, dy, lift, rem );

      do
      {
        delta = lift;
        mod  += rem;
        if ( mod >= (TCoord)dy )
        {
          mod -= (TCoord)dy;
          delta++;
        }

        x2 = x + delta;
        gray_render_scanline( RAS_VAR_ ey1,
                                       x, ONE_PIXEL - first,
                                       x2, first );
        x = x2;

        ey1 += incr;
        gray_set_cell( RAS_VAR_ TRUNC( x ), ey1 );
      } while ( ey1 != ey2 );
    }

    gray_render_scanline( RAS_VAR_ ey1,
                                   x, ONE_PIXEL - first,
                                   to_x, fy2 );

  End:
    ras.x       = to_x;
    ras.y       = to_y;
  }